

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thrdd.c
# Opt level: O1

void Curl_async_thrdd_shutdown(Curl_easy *data)

{
  curl_socket_t s;
  int iVar1;
  async_thrdd_addr_ctx *paVar2;
  curl_trc_feat *pcVar3;
  
  paVar2 = (data->state).async.thrdd.addr;
  if (((paVar2 != (async_thrdd_addr_ctx *)0x0) && (paVar2->thread_hnd != (pthread_t *)0x0)) &&
     (((data->set).field_0x89d & 2) == 0)) {
    asyn_thrdd_await(data,paVar2,(Curl_dns_entry **)0x0);
    return;
  }
  paVar2 = (data->state).async.thrdd.addr;
  if (paVar2 != (async_thrdd_addr_ctx *)0x0) {
    s = paVar2->sock_pair[0];
    pthread_mutex_lock((pthread_mutex_t *)&paVar2->mutx);
    (data->state).async.thrdd.addr = (async_thrdd_addr_ctx *)0x0;
    paVar2->ref_count = paVar2->ref_count + -1;
    if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
        ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level))))
       && (0 < Curl_trc_feat_dns.log_level)) {
      Curl_trc_dns(data,"resolve, destroy async data, shared ref=%d");
    }
    iVar1 = paVar2->ref_count;
    pthread_mutex_unlock((pthread_mutex_t *)&paVar2->mutx);
    if (iVar1 == 0) {
      if (paVar2->thread_hnd != (pthread_t *)0x0) {
        Curl_thread_join(&paVar2->thread_hnd);
      }
      addr_ctx_destroy(paVar2);
    }
    else {
      Curl_thread_destroy(&paVar2->thread_hnd);
    }
    Curl_multi_will_close(data,s);
    close(s);
    return;
  }
  return;
}

Assistant:

void Curl_async_thrdd_shutdown(struct Curl_easy *data)
{
  struct async_thrdd_ctx *thrdd = &data->state.async.thrdd;

  /* If we are still resolving, we must wait for the threads to fully clean up,
     unfortunately. Otherwise, we can simply cancel to clean up any resolver
     data. */
  if(thrdd->addr && (thrdd->addr->thread_hnd != curl_thread_t_null) &&
     !data->set.quick_exit)
    (void)asyn_thrdd_await(data, thrdd->addr, NULL);
  else
    async_thrdd_destroy(data);
}